

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

vec3 __thiscall djb::microfacet::u2_to_h2(microfacet *this,vec2 *u,vec3 *wi,args *args)

{
  float_t fVar1;
  vec3 vVar2;
  vec3 local_70;
  vec3 local_60;
  vec3 local_50;
  mat3 local_40;
  
  local_40.r[0] = djb::operator*(&args->minv,wi);
  local_50 = normalize(local_40.r);
  fVar1 = local_50.z;
  (*(this->super_brdf)._vptr_brdf[0xc])(this,u);
  local_60.z = fVar1;
  transpose(&args->minv);
  local_70 = djb::operator*(&local_40,&local_60);
  vVar2 = normalize(&local_70);
  return vVar2;
}

Assistant:

vec3
microfacet::u2_to_h2(const vec2 &u, const vec3 &wi, const args &args) const
{
	vec3 wi_std = normalize(args.minv * wi);
	vec3 wm_std = u2_to_h2_std(u, wi_std);
	vec3 wm = normalize(transpose(args.minv) * wm_std);

	return wm;
}